

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void DrawTexturePro(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,float rotation,
                   Color tint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_108;
  float local_f8;
  float local_e8;
  float local_d8;
  float local_c8;
  float local_68;
  float local_58;
  float local_48;
  
  fVar4 = origin.x;
  fVar5 = origin.y;
  local_58 = dest.x;
  local_68 = dest.y;
  fVar2 = source.x;
  fVar6 = source.y;
  if (texture.id == 0) {
    return;
  }
  fVar3 = source.width;
  fVar7 = source.height;
  fVar10 = fVar3;
  if (fVar3 < 0.0) {
    fVar10 = -fVar3;
  }
  if (fVar7 < 0.0) {
    fVar6 = fVar6 - fVar7;
  }
  if ((rotation != 0.0) || (NAN(rotation))) {
    local_f8 = sinf(rotation * 0.017453292);
    fVar1 = cosf(rotation * 0.017453292);
    fVar9 = dest.width - fVar4;
    local_c8 = dest.height - fVar5;
    fVar8 = fVar9 * fVar1 + local_58;
    local_d8 = local_58 - fVar4 * fVar1;
    local_58 = fVar5 * local_f8 + local_d8;
    fVar9 = fVar9 * local_f8 + local_68;
    local_48 = local_68 - fVar4 * local_f8;
    local_68 = -fVar5 * fVar1 + local_48;
    local_108 = fVar5 * local_f8 + fVar8;
    local_e8 = -fVar5 * fVar1 + fVar9;
    local_f8 = -local_c8 * local_f8;
    local_d8 = local_d8 + local_f8;
    local_c8 = local_c8 * fVar1;
    local_48 = local_48 + local_c8;
    local_f8 = local_f8 + fVar8;
    local_c8 = local_c8 + fVar9;
  }
  else {
    local_58 = local_58 - fVar4;
    local_68 = local_68 - fVar5;
    local_108 = local_58 + dest.width;
    local_48 = local_68 + dest.height;
    local_f8 = local_108;
    local_d8 = local_58;
    local_c8 = local_48;
    local_e8 = local_68;
  }
  rlCheckRenderBatchLimit(4);
  rlSetTexture(texture.id);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  rlNormal3f(0.0,0.0,1.0);
  fVar4 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar2 |
                 -(uint)(fVar3 < 0.0) & (uint)(fVar10 + fVar2)) / (float)texture.width;
  fVar5 = fVar6 / (float)texture.height;
  rlTexCoord2f(fVar4,fVar5);
  rlVertex2f(local_58,local_68);
  fVar6 = (fVar7 + fVar6) / (float)texture.height;
  rlTexCoord2f(fVar4,fVar6);
  rlVertex2f(local_d8,local_48);
  if (0.0 <= fVar3) {
    fVar2 = fVar10 + fVar2;
  }
  fVar2 = fVar2 / (float)texture.width;
  rlTexCoord2f(fVar2,fVar6);
  rlVertex2f(local_f8,local_c8);
  rlTexCoord2f(fVar2,fVar5);
  rlVertex2f(local_108,local_e8);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTexturePro(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flipX = false;

        if (source.width < 0) { flipX = true; source.width *= -1; }
        if (source.height < 0) source.y -= source.height;

        Vector2 topLeft = { 0 };
        Vector2 topRight = { 0 };
        Vector2 bottomLeft = { 0 };
        Vector2 bottomRight = { 0 };

        // Only calculate rotation if needed
        if (rotation == 0.0f)
        {
            float x = dest.x - origin.x;
            float y = dest.y - origin.y;
            topLeft = (Vector2){ x, y };
            topRight = (Vector2){ x + dest.width, y };
            bottomLeft = (Vector2){ x, y + dest.height };
            bottomRight = (Vector2){ x + dest.width, y + dest.height };
        }
        else
        {
            float sinRotation = sinf(rotation*DEG2RAD);
            float cosRotation = cosf(rotation*DEG2RAD);
            float x = dest.x;
            float y = dest.y;
            float dx = -origin.x;
            float dy = -origin.y;

            topLeft.x = x + dx*cosRotation - dy*sinRotation;
            topLeft.y = y + dx*sinRotation + dy*cosRotation;

            topRight.x = x + (dx + dest.width)*cosRotation - dy*sinRotation;
            topRight.y = y + (dx + dest.width)*sinRotation + dy*cosRotation;

            bottomLeft.x = x + dx*cosRotation - (dy + dest.height)*sinRotation;
            bottomLeft.y = y + dx*sinRotation + (dy + dest.height)*cosRotation;

            bottomRight.x = x + (dx + dest.width)*cosRotation - (dy + dest.height)*sinRotation;
            bottomRight.y = y + (dx + dest.width)*sinRotation + (dy + dest.height)*cosRotation;
        }

        rlCheckRenderBatchLimit(4);     // Make sure there is enough free space on the batch buffer

        rlSetTexture(texture.id);
        rlBegin(RL_QUADS);

            rlColor4ub(tint.r, tint.g, tint.b, tint.a);
            rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

            // Top-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
            else rlTexCoord2f(source.x/width, source.y/height);
            rlVertex2f(topLeft.x, topLeft.y);

            // Bottom-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            rlVertex2f(bottomLeft.x, bottomLeft.y);

            // Bottom-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            rlVertex2f(bottomRight.x, bottomRight.y);

            // Top-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, source.y/height);
            else rlTexCoord2f((source.x + source.width)/width, source.y/height);
            rlVertex2f(topRight.x, topRight.y);

        rlEnd();
        rlSetTexture(0);

        // NOTE: Vertex position can be transformed using matrices
        // but the process is way more costly than just calculating
        // the vertex positions manually, like done above.
        // I leave here the old implementation for educational pourposes,
        // just in case someone wants to do some performance test
        /*
        rlSetTexture(texture.id);
        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            if (rotation != 0.0f) rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
                else rlTexCoord2f(source.x/width, source.y/height);
                rlVertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                rlVertex2f(0.0f, dest.height);

                // Top-right corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                rlVertex2f(dest.width, dest.height);

                // Top-left corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, source.y/height);
                else rlTexCoord2f((source.x + source.width)/width, source.y/height);
                rlVertex2f(dest.width, 0.0f);
            rlEnd();
        rlPopMatrix();
        rlSetTexture(0);
        */
    }
}